

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O1

void __thiscall Assimp::Discreet3DSImporter::ParseLightChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  aiLight *paVar1;
  uint _limit;
  float fVar2;
  float fVar3;
  ai_real aVar4;
  float fVar5;
  Chunk chunk;
  Chunk local_26;
  
  if (5 < (uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current)) {
    do {
      ReadChunk(this,&local_26);
      if (0 < (int)(local_26.Size - 6)) {
        this_00 = this->stream;
        _limit = StreamReader<false,_false>::SetReadLimit
                           (this_00,(local_26.Size - 6) +
                                    (*(int *)&this_00->current - *(int *)&this_00->buffer));
        paVar1 = (this->mScene->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1];
        if (local_26.Flag < 0x4610) {
          if ((local_26.Flag == 0x10) || (local_26.Flag == 0x13)) {
            fVar2 = StreamReader<false,_false>::Get<float>(this->stream);
            (paVar1->mColorDiffuse).r = fVar2 * (paVar1->mColorDiffuse).r;
            fVar2 = StreamReader<false,_false>::Get<float>(this->stream);
            (paVar1->mColorDiffuse).g = fVar2 * (paVar1->mColorDiffuse).g;
            fVar2 = StreamReader<false,_false>::Get<float>(this->stream);
            aVar4 = fVar2 * (paVar1->mColorDiffuse).b;
            goto LAB_003fb808;
          }
        }
        else if (local_26.Flag == 0x465b) {
          fVar2 = StreamReader<false,_false>::Get<float>(this->stream);
          aVar4 = fVar2 * (paVar1->mColorDiffuse).b;
          (paVar1->mColorDiffuse).r = (paVar1->mColorDiffuse).r * fVar2;
          (paVar1->mColorDiffuse).g = (paVar1->mColorDiffuse).g * fVar2;
LAB_003fb808:
          (paVar1->mColorDiffuse).b = aVar4;
        }
        else if (local_26.Flag == 0x4625) {
          fVar2 = StreamReader<false,_false>::Get<float>(this->stream);
          paVar1->mAttenuationLinear = fVar2;
        }
        else if (local_26.Flag == 0x4610) {
          paVar1->mType = aiLightSource_SPOT;
          fVar2 = StreamReader<false,_false>::Get<float>(this->stream);
          (paVar1->mDirection).x = fVar2 - (paVar1->mPosition).x;
          fVar2 = StreamReader<false,_false>::Get<float>(this->stream);
          (paVar1->mDirection).y = fVar2 - (paVar1->mPosition).y;
          fVar3 = StreamReader<false,_false>::Get<float>(this->stream);
          fVar3 = fVar3 - (paVar1->mPosition).z;
          (paVar1->mDirection).z = fVar3;
          fVar2 = (paVar1->mDirection).x;
          fVar5 = (paVar1->mDirection).y;
          fVar2 = fVar3 * fVar3 + fVar2 * fVar2 + fVar5 * fVar5;
          if (fVar2 < 0.0) {
            fVar2 = sqrtf(fVar2);
          }
          else {
            fVar2 = SQRT(fVar2);
          }
          fVar2 = 1.0 / fVar2;
          (paVar1->mDirection).x = (paVar1->mDirection).x * fVar2;
          (paVar1->mDirection).y = (paVar1->mDirection).y * fVar2;
          (paVar1->mDirection).z = fVar2 * (paVar1->mDirection).z;
          fVar2 = StreamReader<false,_false>::Get<float>(this->stream);
          paVar1->mAngleInnerCone = fVar2 * 0.017453292;
          fVar5 = StreamReader<false,_false>::Get<float>(this->stream);
          paVar1->mAngleOuterCone = fVar5 * 0.017453292 + fVar2 * 0.017453292;
        }
        this->stream->current = this->stream->limit;
        StreamReader<false,_false>::SetReadLimit(this->stream,_limit);
        if (*(int *)&this->stream->limit == *(int *)&this->stream->current) {
          return;
        }
      }
    } while (5 < (uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current));
  }
  return;
}

Assistant:

void Discreet3DSImporter::ParseLightChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();
    aiLight* light = mScene->mLights.back();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_DL_SPOTLIGHT:
        // Now we can be sure that the light is a spot light
        light->mType = aiLightSource_SPOT;

        // We wouldn't need to normalize here, but we do it
        light->mDirection.x = stream->GetF4() - light->mPosition.x;
        light->mDirection.y = stream->GetF4() - light->mPosition.y;
        light->mDirection.z = stream->GetF4() - light->mPosition.z;
        light->mDirection.Normalize();

        // Now the hotspot and falloff angles - in degrees
        light->mAngleInnerCone = AI_DEG_TO_RAD( stream->GetF4() );

        // FIX: the falloff angle is just an offset
        light->mAngleOuterCone = light->mAngleInnerCone+AI_DEG_TO_RAD( stream->GetF4() );
        break;

        // intensity multiplier
    case Discreet3DS::CHUNK_DL_MULTIPLIER:
        light->mColorDiffuse = light->mColorDiffuse * stream->GetF4();
        break;

        // light color
    case Discreet3DS::CHUNK_RGBF:
    case Discreet3DS::CHUNK_LINRGBF:
        light->mColorDiffuse.r *= stream->GetF4();
        light->mColorDiffuse.g *= stream->GetF4();
        light->mColorDiffuse.b *= stream->GetF4();
        break;

        // light attenuation
    case Discreet3DS::CHUNK_DL_ATTENUATE:
        light->mAttenuationLinear = stream->GetF4();
        break;
    };

    ASSIMP_3DS_END_CHUNK();
}